

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall LiteralsTest_NamedArg_Test::TestBody(LiteralsTest_NamedArg_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<wchar_t> format_str_01;
  basic_string_view<wchar_t> format_str_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_02;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> udl_a_w;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> udl_a;
  AssertHelper local_978;
  undefined8 local_970;
  wchar_t *local_968;
  undefined4 local_958;
  wchar_t *local_948;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_940;
  undefined4 local_920 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_918;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_910;
  wchar_t *local_8f0;
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined4 local_8d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_8c0;
  wchar_t *local_8b8;
  undefined8 local_8b0;
  wchar_t *local_8a8;
  undefined4 local_898;
  wchar_t *local_888;
  undefined4 local_87c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  undefined1 *local_858 [2];
  wchar_t **local_848;
  wchar_t **local_838;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_820;
  undefined1 *local_818;
  long lStack_810;
  undefined8 local_808;
  undefined1 local_800 [2000];
  
  local_858[0] = (undefined1 *)&local_978;
  local_978.data_ = (AssertHelperData *)0x248d2a;
  local_970 = 5;
  local_948 = L"abra";
  local_848 = &local_8b8;
  local_8b8 = L"second";
  local_8b0 = 6;
  local_888 = L"cad";
  local_8c0 = &local_940;
  local_940._M_dataplus._M_p._0_4_ = 99;
  local_838 = &local_8f0;
  local_8f0 = L"third";
  local_8e8 = 5;
  local_968 = L"abra";
  local_958 = 10;
  local_8a8 = L"cad";
  local_898 = 10;
  local_8e0 = 99;
  local_8d0 = 2;
  local_818 = local_800;
  lStack_810 = 0;
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_808 = 500;
  format_str.size_ = 0x1d;
  format_str.data_ = "{first}{second}{first}{third}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_858;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::named_arg<char_const(&)[5],char>,fmt::v5::internal::named_arg<char_const(&)[4],char>,fmt::v5::internal::named_arg<int,char>>
                ::TYPES;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str,args,(locale_ref)0x0);
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_878,local_818,local_818 + lStack_810);
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
  local_978.data_ = (AssertHelperData *)0x248d2a;
  local_970 = 5;
  local_948 = L"abra";
  local_8b8 = L"second";
  local_8b0 = 6;
  local_888 = L"cad";
  local_8c0 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_920;
  local_920[0] = 99;
  local_8f0 = L"third";
  local_8e8 = 5;
  local_968 = L"abra";
  local_958 = 10;
  local_8a8 = L"cad";
  local_898 = 10;
  local_848 = &local_8b8;
  local_8e0 = 99;
  local_8d0 = 2;
  local_838 = &local_8f0;
  lStack_810 = 0;
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_818 = local_800;
  local_808 = 500;
  format_str_00.size_ = 0x1d;
  format_str_00.data_ = "{first}{second}{first}{third}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_858;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::named_arg<char[5],char>,fmt::v5::internal::named_arg<char[4],char>,fmt::v5::internal::named_arg<int,char>>
       ::TYPES;
  local_858[0] = (undefined1 *)&local_978;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str_00,args_00,(locale_ref)0x0);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_940,local_818,local_818 + lStack_810);
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_910,
             "format(\"{first}{second}{first}{third}\", fmt::arg(\"first\", \"abra\"), fmt::arg(\"second\", \"cad\"), fmt::arg(\"third\", 99))"
             ,"udl_a",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_940,&local_878);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if ((char)local_910._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_820);
    if ((undefined8 *)local_910._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_910._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_978,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x767,pcVar2);
    testing::internal::AssertHelper::operator=(&local_978,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_978);
    if (local_820.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_820.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_820.ptr_ + 8))();
      }
      local_820.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_910._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_978.data_ = (AssertHelperData *)0x24bc6c;
  local_970 = 5;
  local_948 = L"abra";
  local_8b8 = L"second";
  local_8b0 = 6;
  local_888 = L"cad";
  local_910._M_dataplus._M_p._0_4_ = 99;
  local_8f0 = L"third";
  local_8e8 = 5;
  local_968 = L"abra";
  local_958 = 10;
  local_8a8 = L"cad";
  local_898 = 10;
  local_848 = &local_8b8;
  local_8e0 = 99;
  local_8d0 = 2;
  local_838 = &local_8f0;
  lStack_810 = 0;
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8d18
  ;
  local_818 = local_800;
  local_808 = 500;
  format_str_01.size_ = 0x1d;
  format_str_01.data_ = L"{first}{second}{first}{third}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_858;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,fmt::v5::internal::named_arg<wchar_t_const(&)[5],wchar_t>,fmt::v5::internal::named_arg<wchar_t_const(&)[4],wchar_t>,fmt::v5::internal::named_arg<int,wchar_t>>
       ::TYPES;
  local_8c0 = &local_910;
  local_858[0] = (undefined1 *)&local_978;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_01,args_01,(locale_ref)0x0);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_940,local_818,local_818 + lStack_810 * 4);
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8d18
  ;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
  local_978.data_ = (AssertHelperData *)0x24bc6c;
  local_970 = 5;
  local_948 = L"abra";
  local_8b8 = L"second";
  local_8b0 = 6;
  local_888 = L"cad";
  local_8c0 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              &local_87c;
  local_87c = 99;
  local_8f0 = L"third";
  local_8e8 = 5;
  local_968 = L"abra";
  local_958 = 10;
  local_8a8 = L"cad";
  local_898 = 10;
  local_848 = &local_8b8;
  local_8e0 = 99;
  local_8d0 = 2;
  local_838 = &local_8f0;
  lStack_810 = 0;
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8d18
  ;
  local_818 = local_800;
  local_808 = 500;
  format_str_02.size_ = 0x1d;
  format_str_02.data_ = L"{first}{second}{first}{third}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_858;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,fmt::v5::internal::named_arg<wchar_t[5],wchar_t>,fmt::v5::internal::named_arg<wchar_t[4],wchar_t>,fmt::v5::internal::named_arg<int,wchar_t>>
       ::TYPES;
  local_858[0] = (undefined1 *)&local_978;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_02,args_02,(locale_ref)0x0);
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_910,local_818,local_818 + lStack_810 * 4);
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8d18
  ;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)local_920,
             "format(L\"{first}{second}{first}{third}\", fmt::arg(L\"first\", L\"abra\"), fmt::arg(L\"second\", L\"cad\"), fmt::arg(L\"third\", 99))"
             ,"udl_a_w",&local_910,&local_940);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p);
  }
  if (local_920[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_918.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_918.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_978,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x76d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_978,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_978);
    if (local_820.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_820.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_820.ptr_ + 8))();
      }
      local_820.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_918,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(BoolTest, FormatBool) {
  EXPECT_EQ("true", format("{}", true));
  EXPECT_EQ("false", format("{}", false));
  EXPECT_EQ("1", format("{:d}", true));
  EXPECT_EQ("true ", format("{:5}", true));
  EXPECT_EQ(L"true", format(L"{}", true));
}